

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *pMVar3;
  char *failure_msg;
  void *pvVar4;
  int line;
  Arena *arena;
  FeatureSetDefaults_FeatureSetEditionDefault *_this;
  FeatureSetDefaults_FeatureSetEditionDefault *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (FeatureSetDefaults_FeatureSetEditionDefault *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault_const*,google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault*>
                          ((FeatureSetDefaults_FeatureSetEditionDefault **)local_28,&local_30,
                           "&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x36c1;
LAB_0017e777:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      pMVar2 = (MessageLite *)from_msg[1]._internal_metadata_.ptr_;
      if (pMVar2 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.overridable_features_ != nullptr";
        line = 0x36c8;
        goto LAB_0017e777;
      }
      pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 8);
      if (pMVar3 == (MessageLite *)0x0) {
        pvVar4 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,pMVar2);
        *(void **)((long)&local_30->field_0 + 8) = pvVar4;
      }
      else {
        FeatureSet::MergeImpl(pMVar3,pMVar2);
      }
    }
    if ((uVar1 & 2) != 0) {
      pMVar2 = (MessageLite *)from_msg[2]._vptr_MessageLite;
      if (pMVar2 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.fixed_features_ != nullptr";
        line = 0x36d0;
        goto LAB_0017e777;
      }
      pMVar3 = *(MessageLite **)((long)&local_30->field_0 + 0x10);
      if (pMVar3 == (MessageLite *)0x0) {
        pvVar4 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,pMVar2);
        *(void **)((long)&local_30->field_0 + 0x10) = pvVar4;
      }
      else {
        FeatureSet::MergeImpl(pMVar3,pMVar2);
      }
    }
    if ((uVar1 & 4) != 0) {
      *(int *)((long)&local_30->field_0 + 0x18) = (int)from_msg[2]._internal_metadata_.ptr_;
    }
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void FeatureSetDefaults_FeatureSetEditionDefault::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FeatureSetDefaults_FeatureSetEditionDefault*>(&to_msg);
  auto& from = static_cast<const FeatureSetDefaults_FeatureSetEditionDefault&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.overridable_features_ != nullptr);
      if (_this->_impl_.overridable_features_ == nullptr) {
        _this->_impl_.overridable_features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.overridable_features_);
      } else {
        _this->_impl_.overridable_features_->MergeFrom(*from._impl_.overridable_features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.fixed_features_ != nullptr);
      if (_this->_impl_.fixed_features_ == nullptr) {
        _this->_impl_.fixed_features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.fixed_features_);
      } else {
        _this->_impl_.fixed_features_->MergeFrom(*from._impl_.fixed_features_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.edition_ = from._impl_.edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}